

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

NULLCRef * NULLC::AutoArrayIndex(NULLCRef *__return_storage_ptr__,NULLCAutoArray *left,uint index)

{
  uint uVar1;
  char *pcVar2;
  
  *(undefined4 *)((long)&__return_storage_ptr__->ptr + 4) = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  if (left == (NULLCAutoArray *)0x0) {
    pcVar2 = "ERROR: null pointer access";
  }
  else {
    if (index < left->len) {
      uVar1 = left->typeID;
      __return_storage_ptr__->typeID = uVar1;
      pcVar2 = left->ptr;
      uVar1 = nullcGetTypeSize(uVar1);
      __return_storage_ptr__->ptr = pcVar2 + uVar1 * index;
      return __return_storage_ptr__;
    }
    pcVar2 = "ERROR: array index out of bounds";
  }
  nullcThrowError(pcVar2);
  return __return_storage_ptr__;
}

Assistant:

NULLCRef NULLC::AutoArrayIndex(NULLCAutoArray* left, unsigned int index)
{
	NULLCRef ret = { 0, 0 };

	if(!left)
	{
		nullcThrowError("ERROR: null pointer access");
		return ret;
	}
	if(index >= left->len)
	{
		nullcThrowError("ERROR: array index out of bounds");
		return ret;
	}
	ret.typeID = left->typeID;
	ret.ptr = (char*)left->ptr + index * nullcGetTypeSize(ret.typeID);
	return ret;
}